

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * isEnv(Proto *p,int pc,Instruction i,int isup)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  uint reg;
  char *name;
  int local_c;
  char *local_8;
  
  reg = i >> 0x10 & 0xff;
  local_c = pc;
  if (isup == 0) {
    basicgetobjname(p,&local_c,reg,&local_8);
  }
  else {
    lVar1 = *(long *)((long)&p->upvalues->name + (ulong)(reg << 4));
    local_8 = "?";
    if (lVar1 != 0) {
      local_8 = (char *)(lVar1 + 0x18);
    }
  }
  if (local_8 == (char *)0x0) {
    pcVar3 = "field";
  }
  else {
    iVar2 = strcmp(local_8,"_ENV");
    pcVar3 = "field";
    if (iVar2 == 0) {
      pcVar3 = "global";
    }
  }
  return pcVar3;
}

Assistant:

static const char *isEnv (const Proto *p, int pc, Instruction i, int isup) {
  int t = GETARG_B(i);  /* table index */
  const char *name;  /* name of indexed variable */
  if (isup)  /* is 't' an upvalue? */
    name = upvalname(p, t);
  else  /* 't' is a register */
    basicgetobjname(p, &pc, t, &name);
  return (name && strcmp(name, LUA_ENV) == 0) ? "global" : "field";
}